

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDASetJacTimesResFn(void *ida_mem,IDAResFn jtimesResFn)

{
  long in_RSI;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  IDAMem local_20;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(IDALsMem *)0x11c1d9);
  if (local_4 == 0) {
    if (*(int *)((long)in_stack_ffffffffffffffd8 + 0x120) == 0) {
      IDAProcessError(local_20,-3,0x20f,"IDASetJacTimesResFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                      ,"Internal finite-difference Jacobian-vector product is disabled.");
      local_4 = -3;
    }
    else {
      if (in_RSI == 0) {
        *(IDAResFn *)((long)in_stack_ffffffffffffffd8 + 0x138) = local_20->ida_res;
      }
      else {
        *(long *)((long)in_stack_ffffffffffffffd8 + 0x138) = in_RSI;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int IDASetJacTimesResFn(void* ida_mem, IDAResFn jtimesResFn)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(idals_mem->jtimesDQ))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (IDALS_ILL_INPUT);
  }

  /* store function pointers for Res function (NULL implies use DAE Res) */
  if (jtimesResFn != NULL) { idals_mem->jt_res = jtimesResFn; }
  else { idals_mem->jt_res = IDA_mem->ida_res; }

  return (IDALS_SUCCESS);
}